

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleNamespace.cpp
# Opt level: O1

ModuleNamespace * Js::ModuleNamespace::GetModuleNamespace(ModuleRecordBase *requestModule)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  SourceTextModuleRecord *moduleRecord;
  undefined4 extraout_var;
  Recycler *alloc;
  ModuleNamespace *this;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  iVar4 = (*(requestModule->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0xd])();
  if ((char)iVar4 == '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ModuleNamespace.cpp"
                                ,0x18,"(requestModule->IsSourceTextModuleRecord())",
                                "requestModule->IsSourceTextModuleRecord()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  moduleRecord = SourceTextModuleRecord::FromHost(requestModule);
  iVar4 = (*(moduleRecord->super_ModuleRecordBase).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[6])(moduleRecord);
  this = (ModuleNamespace *)CONCAT44(extraout_var,iVar4);
  if (this == (ModuleNamespace *)0x0) {
    pSVar1 = (((moduleRecord->super_ModuleRecordBase).javascriptLibrary.ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
    local_48 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4fcc938;
    data.filename._0_4_ = 0x22;
    alloc = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_48);
    this = (ModuleNamespace *)new<Memory::Recycler>(0x48,alloc,0x38bbb2);
    ModuleNamespace(this,&moduleRecord->super_ModuleRecordBase,
                    (((pSVar1->super_ScriptContextBase).javascriptLibrary)->moduleNamespaceType).ptr
                   );
    Initialize(this);
    (*(moduleRecord->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[7])(moduleRecord,this);
  }
  return this;
}

Assistant:

ModuleNamespace* ModuleNamespace::GetModuleNamespace(ModuleRecordBase* requestModule)
    {
        Assert(requestModule->IsSourceTextModuleRecord());
        SourceTextModuleRecord* moduleRecord = SourceTextModuleRecord::FromHost(requestModule);
        ModuleNamespace* nsObject = moduleRecord->GetNamespace();
        if (nsObject != nullptr)
        {
            return nsObject;
        }
        ScriptContext* scriptContext = moduleRecord->GetRealm()->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        nsObject = RecyclerNew(recycler, ModuleNamespace, moduleRecord, scriptContext->GetLibrary()->GetModuleNamespaceType());
        nsObject->Initialize();

        moduleRecord->SetNamespace(nsObject);
        return nsObject;
    }